

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

ENetSocket enet_socket_accept(ENetSocket socket,ENetAddress *address)

{
  sockaddr *__addr;
  int iVar1;
  socklen_t *__addr_len;
  socklen_t sinLength;
  sockaddr_in6 sin;
  socklen_t local_30;
  sockaddr local_2c;
  undefined8 uStack_1c;
  enet_uint16 local_14;
  
  __addr_len = &local_30;
  local_30 = 0x1c;
  __addr = &local_2c;
  if (address == (ENetAddress *)0x0) {
    __addr_len = (socklen_t *)0x0;
    __addr = (sockaddr *)0x0;
  }
  iVar1 = accept(socket,__addr,__addr_len);
  if (iVar1 != -1 && address != (ENetAddress *)0x0) {
    *(undefined8 *)&(address->host).__in6_u = local_2c.sa_data._6_8_;
    *(undefined8 *)((long)&(address->host).__in6_u + 8) = uStack_1c;
    address->port = local_2c.sa_data._0_2_ << 8 | (ushort)local_2c.sa_data._0_2_ >> 8;
    address->sin6_scope_id = local_14;
  }
  return iVar1;
}

Assistant:

ENetSocket enet_socket_accept(ENetSocket socket, ENetAddress *address) {
        int result;
        struct sockaddr_in6 sin;
        socklen_t sinLength = sizeof(struct sockaddr_in6);

        result = accept(socket,address != NULL ? (struct sockaddr *) &sin : NULL, address != NULL ? &sinLength : NULL);

        if (result == -1) {
            return ENET_SOCKET_NULL;
        }

        if (address != NULL) {
            address->host = sin.sin6_addr;
            address->port = ENET_NET_TO_HOST_16 (sin.sin6_port);
            address->sin6_scope_id = sin.sin6_scope_id;
        }

        return result;
    }